

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool art_node_init_iterator(art_ref_t ref,art_iterator_t *iterator,_Bool first)

{
  byte bVar1;
  unkbyte9 Var2;
  ulong uVar3;
  undefined4 *puVar4;
  art_node_t *node;
  art_typecode_t typecode;
  art_indexed_child_t aVar5;
  
  uVar3 = ref & 0xff;
  while (uVar3 != 1) {
    node = (art_node_t *)((ref >> 0x10) * ART_NODE_SIZES[uVar3] + (long)iterator->art->nodes[uVar3])
    ;
    if (first) {
      aVar5 = art_node_next_child(node,(art_typecode_t)ref,-1);
      Var2 = aVar5._0_9_;
    }
    else {
      aVar5 = art_node_prev_child(node,(art_typecode_t)ref,0x100);
      Var2 = aVar5._0_9_;
    }
    art_iterator_down(iterator,ref,(uint8_t)((unkuint9)Var2 >> 0x40));
    ref = (ulong)Var2;
    uVar3 = (ulong)Var2 & 0xff;
  }
  bVar1 = iterator->frame;
  iterator->frames[bVar1].ref = ref;
  iterator->frames[bVar1].index_in_node = '\0';
  puVar4 = (undefined4 *)((long)iterator->art->nodes[1] + (ref >> 0xc & 0xfffffffffffffff0));
  *(undefined4 *)iterator->key = *puVar4;
  *(undefined2 *)(iterator->key + 4) = *(undefined2 *)(puVar4 + 1);
  iterator->value = (art_val_t *)(puVar4 + 2);
  return SUB81(puVar4 + 2,0);
}

Assistant:

static bool art_node_init_iterator(art_ref_t ref, art_iterator_t *iterator,
                                   bool first) {
    while (!art_is_leaf(ref)) {
        art_node_t *node = art_deref(iterator->art, ref);
        art_indexed_child_t indexed_child;
        if (first) {
            indexed_child =
                art_node_next_child(node, art_ref_typecode(ref), -1);
        } else {
            indexed_child =
                art_node_prev_child(node, art_ref_typecode(ref), 256);
        }
        art_iterator_down(iterator, ref, indexed_child.index);
        ref = indexed_child.child;
    }
    // We're at a leaf.
    iterator->frames[iterator->frame].ref = ref;
    iterator->frames[iterator->frame].index_in_node = 0;  // Should not matter.
    return art_iterator_valid_loc(iterator, ref);
}